

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

bool __thiscall
LLVMBC::ModuleParseContext::parse_type(ModuleParseContext *this,BlockOrRecord *child)

{
  long lVar1;
  ulong uVar2;
  ulong *puVar3;
  iterator __position;
  iterator __position_00;
  Type *pTVar4;
  pointer puVar5;
  LoggingCallback p_Var6;
  void *pvVar7;
  FunctionType *type;
  bool bVar8;
  ulong uVar9;
  uint uVar10;
  Type *func_type;
  Vector<Type_*> members;
  Type *in_stack_ffffffffffffefa8;
  Type *in_stack_ffffffffffffefb0;
  pointer ppTVar11;
  vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_> local_1038 [171];
  
  bVar8 = true;
  switch(child->id) {
  case 1:
  case 0x13:
    goto switchD_001885bb_caseD_1;
  case 2:
    type = (FunctionType *)Type::getVoidTy(this->context);
    break;
  case 3:
    type = (FunctionType *)Type::getFloatTy(this->context);
    break;
  case 4:
    type = (FunctionType *)Type::getDoubleTy(this->context);
    break;
  case 5:
    type = (FunctionType *)Type::getLabelTy(this->context);
    break;
  case 6:
    type = (FunctionType *)Type::getOpaqueTy(this->context);
    break;
  case 7:
    puVar3 = (child->ops).
             super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (((child->ops).
         super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish == puVar3) || (uVar9 = *puVar3, 0x40 < uVar9))
    goto LAB_001889be;
    type = (FunctionType *)Type::getIntTy(this->context,(uint32_t)uVar9);
    break;
  case 8:
    puVar3 = (child->ops).
             super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (8 < (ulong)((long)(child->ops).
                          super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3)) {
      uVar9 = *puVar3;
      ppTVar11 = (this->types).
                 super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (uVar9 < (ulong)((long)(this->types).
                                super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar11 >> 3)) {
        pTVar4 = ppTVar11[uVar9];
      }
      else {
        pTVar4 = (Type *)0x0;
      }
      if (pTVar4 == (Type *)0x0) {
LAB_0018898e:
        type = (FunctionType *)0x0;
      }
      else {
        type = (FunctionType *)PointerType::get(in_stack_ffffffffffffefb0,0);
      }
joined_r0x001889b1:
      if (pTVar4 != (Type *)0x0) break;
    }
    goto LAB_001889be;
  default:
    p_Var6 = ::dxil_spv::get_thread_log_callback();
    if (p_Var6 == (LoggingCallback)0x0) {
      parse_type();
    }
    else {
      local_1038[0].
      super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
      super__Vector_impl_data._M_finish._0_7_ = 0xa2165707974;
      local_1038[0].
      super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_7_ = 0x6e776f6e6b6e55;
      local_1038[0].
      super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
      super__Vector_impl_data._M_start._7_1_ = 0x20;
      pvVar7 = ::dxil_spv::get_thread_log_callback_userdata();
      (*p_Var6)(pvVar7,Error,(char *)local_1038);
    }
    goto LAB_001889be;
  case 10:
    type = (FunctionType *)Type::getHalfTy(this->context);
    break;
  case 0xb:
    puVar5 = (child->ops).
             super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (8 < (ulong)((long)(child->ops).
                          super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5)) {
      uVar9 = puVar5[1];
      ppTVar11 = (this->types).
                 super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (uVar9 < (ulong)((long)(this->types).
                                super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar11 >> 3)) {
        pTVar4 = ppTVar11[uVar9];
      }
      else {
        pTVar4 = (Type *)0x0;
      }
      if (pTVar4 == (Type *)0x0) goto LAB_0018898e;
      type = (FunctionType *)
             ArrayType::get(in_stack_ffffffffffffefb0,(uint64_t)in_stack_ffffffffffffefa8);
      goto joined_r0x001889b1;
    }
    goto LAB_001889be;
  case 0xc:
    puVar5 = (child->ops).
             super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (8 < (ulong)((long)(child->ops).
                          super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5)) {
      uVar9 = puVar5[1];
      ppTVar11 = (this->types).
                 super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (uVar9 < (ulong)((long)(this->types).
                                super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar11 >> 3)) {
        pTVar4 = ppTVar11[uVar9];
      }
      else {
        pTVar4 = (Type *)0x0;
      }
      if (pTVar4 == (Type *)0x0) goto LAB_0018898e;
      type = (FunctionType *)VectorType::get(0,in_stack_ffffffffffffefb0);
      goto joined_r0x001889b1;
    }
    goto LAB_001889be;
  case 0x10:
    type = (FunctionType *)Type::getMetadataTy(this->context);
    break;
  case 0x12:
  case 0x14:
    uVar9 = (long)(child->ops).
                  super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(child->ops).
                  super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (uVar9 == 0) goto LAB_001889be;
    local_1038[0].
    super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_7_ = 0;
    local_1038[0].
    super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
    super__Vector_impl_data._M_start._7_1_ = 0;
    local_1038[0].
    super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
    super__Vector_impl_data._M_finish._0_7_ = 0;
    local_1038[0].
    super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
    super__Vector_impl_data._M_finish._7_1_ = 0;
    local_1038[0].
    super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (Type **)0x0;
    uVar10 = (int)(uVar9 >> 3) - 1;
    std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::reserve
              (local_1038,(ulong)uVar10);
    if (uVar10 != 0) {
      uVar9 = 0;
      do {
        uVar2 = (child->ops).
                super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar9 + 1];
        ppTVar11 = (this->types).
                   super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if (uVar2 < (ulong)((long)(this->types).
                                  super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar11 >> 3))
        {
          pTVar4 = ppTVar11[uVar2];
        }
        else {
          pTVar4 = (Type *)0x0;
        }
        __position._M_current._7_1_ =
             local_1038[0].
             super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
             _M_impl.super__Vector_impl_data._M_finish._7_1_;
        __position._M_current._0_7_ =
             local_1038[0].
             super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
             _M_impl.super__Vector_impl_data._M_finish._0_7_;
        if (__position._M_current ==
            local_1038[0].
            super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>>::
          _M_realloc_insert<LLVMBC::Type*>
                    ((vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>> *)
                     local_1038,__position,(Type **)&stack0xffffffffffffefa8);
        }
        else {
          *__position._M_current = pTVar4;
          lVar1 = CONCAT17(local_1038[0].
                           super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish._7_1_,
                           local_1038[0].
                           super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish._0_7_) + 8;
          local_1038[0].
          super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish._0_7_ = (undefined7)lVar1;
          local_1038[0].
          super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish._7_1_ = (undefined1)((ulong)lVar1 >> 0x38);
        }
        uVar9 = uVar9 + 1;
      } while (uVar10 != uVar9);
    }
    ppTVar11 = (pointer)CONCAT17(local_1038[0].
                                 super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start._7_1_,
                                 local_1038[0].
                                 super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start._0_7_);
    local_1038[0].
    super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_7_ = 0;
    local_1038[0].
    super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
    super__Vector_impl_data._M_start._7_1_ = 0;
    local_1038[0].
    super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
    super__Vector_impl_data._M_finish._0_7_ = 0;
    local_1038[0].
    super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
    super__Vector_impl_data._M_finish._7_1_ = 0;
    local_1038[0].
    super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (Type **)0x0;
    type = (FunctionType *)StructType::get(this->context,(Vector<Type_*> *)&stack0xffffffffffffefb0)
    ;
    if (ppTVar11 != (pointer)0x0) {
      ::dxil_spv::free_in_thread(ppTVar11);
    }
    if ((void *)CONCAT17(local_1038[0].
                         super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._7_1_,
                         local_1038[0].
                         super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_7_) != (void *)0x0) {
      ::dxil_spv::free_in_thread
                ((void *)CONCAT17(local_1038[0].
                                  super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start._7_1_,
                                  local_1038[0].
                                  super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start._0_7_));
    }
    break;
  case 0x15:
    uVar9 = (long)(child->ops).
                  super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(child->ops).
                  super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    if (1 < uVar9) {
      local_1038[0].
      super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_7_ = 0;
      local_1038[0].
      super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
      super__Vector_impl_data._M_start._7_1_ = 0;
      local_1038[0].
      super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
      super__Vector_impl_data._M_finish._0_7_ = 0;
      local_1038[0].
      super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
      super__Vector_impl_data._M_finish._7_1_ = 0;
      local_1038[0].
      super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (Type **)0x0;
      std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::reserve
                (local_1038,uVar9 - 2);
      puVar5 = (child->ops).
               super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (0x10 < (ulong)((long)(child->ops).
                               super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5)) {
        uVar9 = 2;
        do {
          ppTVar11 = (this->types).
                     super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (puVar5[uVar9] <
              (ulong)((long)(this->types).
                            super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar11 >> 3)) {
            pTVar4 = ppTVar11[puVar5[uVar9]];
          }
          else {
            pTVar4 = (Type *)0x0;
          }
          __position_00._M_current._7_1_ =
               local_1038[0].
               super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
               _M_impl.super__Vector_impl_data._M_finish._7_1_;
          __position_00._M_current._0_7_ =
               local_1038[0].
               super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
               _M_impl.super__Vector_impl_data._M_finish._0_7_;
          if (__position_00._M_current ==
              local_1038[0].
              super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>>::
            _M_realloc_insert<LLVMBC::Type*>
                      ((vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>> *)
                       local_1038,__position_00,(Type **)&stack0xffffffffffffefa8);
          }
          else {
            *__position_00._M_current = pTVar4;
            lVar1 = CONCAT17(local_1038[0].
                             super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish._7_1_,
                             local_1038[0].
                             super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish._0_7_) + 8;
            local_1038[0].
            super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
            _M_impl.super__Vector_impl_data._M_finish._0_7_ = (undefined7)lVar1;
            local_1038[0].
            super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
            _M_impl.super__Vector_impl_data._M_finish._7_1_ = (undefined1)((ulong)lVar1 >> 0x38);
          }
          uVar9 = uVar9 + 1;
          puVar5 = (child->ops).
                   super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar9 < (ulong)((long)(child->ops).
                                       super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >>
                                3));
      }
      ppTVar11 = (this->types).
                 super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (puVar5[1] <
          (ulong)((long)(this->types).
                        super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar11 >> 3)) {
        pTVar4 = ppTVar11[puVar5[1]];
      }
      else {
        pTVar4 = (Type *)0x0;
      }
      if (pTVar4 == (Type *)0x0) {
        type = (FunctionType *)0x0;
      }
      else {
        type = LLVMContext::
               construct<LLVMBC::FunctionType,LLVMBC::LLVMContext&,LLVMBC::Type*&,std::vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>>>
                         (this->context,this->context,(Type **)&stack0xffffffffffffefa8,local_1038);
      }
      if ((void *)CONCAT17(local_1038[0].
                           super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._7_1_,
                           local_1038[0].
                           super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._0_7_) != (void *)0x0) {
        ::dxil_spv::free_in_thread
                  ((void *)CONCAT17(local_1038[0].
                                    super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start._7_1_,
                                    local_1038[0].
                                    super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_7_));
      }
      goto joined_r0x001889b1;
    }
LAB_001889be:
    bVar8 = false;
    goto switchD_001885bb_caseD_1;
  }
  bVar8 = true;
  add_type(this,&type->super_Type);
switchD_001885bb_caseD_1:
  return bVar8;
}

Assistant:

bool ModuleParseContext::parse_type(const BlockOrRecord &child)
{
	Type *type = nullptr;
	switch (TypeRecord(child.id))
	{
	case TypeRecord::NUMENTRY:
	case TypeRecord::STRUCT_NAME:
		return true;

	case TypeRecord::VOID_TYPE:
		type = Type::getVoidTy(*context);
		break;

	case TypeRecord::HALF:
		type = Type::getHalfTy(*context);
		break;

	case TypeRecord::FLOAT:
		type = Type::getFloatTy(*context);
		break;

	case TypeRecord::DOUBLE:
		type = Type::getDoubleTy(*context);
		break;

	case TypeRecord::POINTER:
	{
		if (child.ops.size() < 2)
			return false;

		auto *pointee_type = get_type(child.ops[0]);
		if (!pointee_type)
			return false;
		type = PointerType::get(pointee_type, child.ops[1]);
		break;
	}

	case TypeRecord::ARRAY:
	{
		if (child.ops.size() < 2)
			return false;

		auto *elem_type = get_type(child.ops[1]);
		if (!elem_type)
			return false;
		type = ArrayType::get(elem_type, child.ops[0]);
		break;
	}

	case TypeRecord::INTEGER:
	{
		if (child.ops.size() < 1)
			return false;

		auto bit_width = child.ops[0];
		if (bit_width <= 64)
			type = Type::getIntTy(*context, unsigned(bit_width));
		else
			return false;
		break;
	}

	case TypeRecord::STRUCT_NAMED:
	case TypeRecord::STRUCT_ANON:
	{
		if (child.ops.size() < 1)
			return false;

		Vector<Type *> members;
		unsigned num_members = child.ops.size() - 1;
		members.reserve(num_members);
		for (unsigned i = 0; i < num_members; i++)
			members.push_back(get_type(child.ops[i + 1]));
		type = StructType::get(*context, std::move(members));
		break;
	}

	case TypeRecord::VECTOR:
	{
		if (child.ops.size() < 2)
			return false;

		auto *elem_type = get_type(child.ops[1]);
		if (!elem_type)
			return false;
		type = VectorType::get(child.ops[0], elem_type);
		break;
	}

	case TypeRecord::FUNCTION:
	{
		if (child.ops.size() < 2)
			return false;
		Vector<Type *> argument_types;
		argument_types.reserve(child.ops.size() - 2);
		for (size_t i = 2; i < child.ops.size(); i++)
			argument_types.push_back(get_type(child.ops[i]));

		auto *func_type = get_type(child.ops[1]);
		if (!func_type)
			return false;

		type = context->construct<FunctionType>(*context, func_type, std::move(argument_types));
		break;
	}

	case TypeRecord::LABEL:
	{
		type = Type::getLabelTy(*context);
		break;
	}

	case TypeRecord::METADATA:
	{
		type = Type::getMetadataTy(*context);
		break;
	}

	case TypeRecord::OPAQUE_TYPE:
	{
		type = Type::getOpaqueTy(*context);
		break;
	}

	default:
		LOGE("Unknown type!\n");
		return false;
	}

	add_type(type);
	return true;
}